

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t)>
               (interval_t *adata,timestamp_t *bdata,timestamp_t *cdata,timestamp_t *result_data,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_timestamp_t_interval_t_timestamp_t_timestamp_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  ulong uVar6;
  timestamp_t tVar7;
  ulong uVar8;
  idx_t i;
  ulong uVar9;
  idx_t row_idx;
  ulong uVar10;
  idx_t row_idx_00;
  idx_t row_idx_01;
  idx_t i_1;
  idx_t row_idx_02;
  interval_t iVar11;
  interval_t iVar12;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
      uVar6 = uVar9;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)asel->sel_vector[uVar9];
      }
      uVar8 = uVar9;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)bsel->sel_vector[uVar9];
      }
      uVar10 = uVar9;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)csel->sel_vector[uVar9];
      }
      uVar1 = adata[uVar6].months;
      uVar3 = adata[uVar6].days;
      iVar11.days = uVar3;
      iVar11.months = uVar1;
      iVar11.micros = adata[uVar6].micros;
      tVar7 = (*fun)(iVar11,bdata[uVar8].value,cdata[uVar10].value);
      result_data[uVar9].value = tVar7.value;
    }
  }
  else {
    for (row_idx_02 = 0; count != row_idx_02; row_idx_02 = row_idx_02 + 1) {
      row_idx_00 = row_idx_02;
      if (asel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)asel->sel_vector[row_idx_02];
      }
      row_idx_01 = row_idx_02;
      if (bsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)bsel->sel_vector[row_idx_02];
      }
      row_idx = row_idx_02;
      if (csel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)csel->sel_vector[row_idx_02];
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar5) {
        bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar5) goto LAB_01dd52dd;
        bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar5) goto LAB_01dd52dd;
        uVar2 = adata[row_idx_00].months;
        uVar4 = adata[row_idx_00].days;
        iVar12.days = uVar4;
        iVar12.months = uVar2;
        iVar12.micros = adata[row_idx_00].micros;
        tVar7 = (*fun)(iVar12,bdata[row_idx_01].value,cdata[row_idx].value);
        result_data[row_idx_02].value = tVar7.value;
      }
      else {
LAB_01dd52dd:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_02);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}